

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib2xor.hpp
# Opt level: O1

void __thiscall
trng::lagfib2xor<unsigned_long,_168U,_521U>::discard
          (lagfib2xor<unsigned_long,_168U,_521U> *this,unsigned_long_long n)

{
  int iVar1;
  GF2 *__cur;
  unsigned_long_long uVar2;
  long lVar3;
  void *__s;
  void *__s_00;
  pointer pGVar4;
  result_type sum;
  ulong uVar5;
  ulong uVar6;
  value_type_conflict2 *__val_1;
  long lVar7;
  size_type i;
  uint uVar8;
  value_type_conflict2 *__val;
  pointer local_68;
  pointer pGStack_60;
  pointer local_58;
  matrix<trng::GF2,_521UL> local_48;
  
  uVar2 = int_math::log2_ceil<unsigned_long_long>(n);
  if (uVar2 * 0x86de8d9 < n) {
    local_68 = (pointer)0x0;
    pGStack_60 = (pointer)0x0;
    local_58 = (pointer)0x0;
    local_68 = (pointer)operator_new(0x42451);
    lVar7 = (long)local_68 + 0x42451;
    pGStack_60 = local_68;
    local_58 = (pointer)lVar7;
    memset(local_68,0,0x42451);
    lVar3 = 1;
    do {
      *(undefined1 *)((long)local_68 + lVar3) = 1;
      lVar3 = lVar3 + 0x20a;
    } while (lVar3 != 0x42451);
    *(undefined1 *)((long)local_68 + 0x42248) = 1;
    *(undefined1 *)((long)local_68 + 0x423a9) = 1;
    pGStack_60 = (pointer)lVar7;
    power<trng::GF2,521ul>
              (&local_48,(trng *)&local_68,(matrix<trng::GF2,_521UL> *)(n - 0x209),
               CONCAT71((int7)((ulong)local_68 >> 8),1));
    pGVar4 = local_68;
    local_68 = local_48.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
               super__Vector_impl_data._M_start;
    pGStack_60 = local_48.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    local_58 = local_48.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    local_48.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pGVar4 != (pointer)0x0) {
      operator_delete(pGVar4);
    }
    if (local_48.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    __s = operator_new(0x1048);
    lVar7 = 0;
    memset(__s,0,0x1048);
    uVar8 = (this->S).index;
    do {
      *(result_type *)((long)__s + lVar7 * 8 + 0x1040) = (this->S).r[uVar8 + (int)lVar7 & 0x3ff];
      lVar7 = lVar7 + -1;
    } while (lVar7 != -0x209);
    __s_00 = operator_new(0x1048);
    lVar7 = 0;
    memset(__s_00,0,0x1048);
    pGVar4 = local_68;
    do {
      lVar3 = 0;
      uVar5 = 0;
      do {
        if (pGVar4[lVar3].value == '\0') {
          uVar6 = 0;
        }
        else {
          uVar6 = *(ulong *)((long)__s + lVar3 * 8);
        }
        uVar5 = uVar5 ^ uVar6;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x209);
      *(ulong *)((long)__s_00 + lVar7 * 8) = uVar5;
      lVar7 = lVar7 + 1;
      pGVar4 = pGVar4 + 0x209;
    } while (lVar7 != 0x209);
    uVar8 = (int)(matrix<trng::GF2,_521UL> *)(n - 0x209) + (this->S).index;
    (this->S).index = uVar8 & 0x3ff;
    lVar7 = 0;
    do {
      (this->S).r[uVar8 + (int)lVar7 & 0x3ff] = *(result_type *)((long)__s_00 + lVar7 * 8 + 0x1040);
      lVar7 = lVar7 + -1;
    } while (lVar7 != -0x209);
    operator_delete(__s_00);
    operator_delete(__s);
    if (local_68 != (pointer)0x0) {
      operator_delete(local_68);
    }
    n = 0x209;
  }
  if (n != 0) {
    uVar5 = (ulong)(this->S).index;
    do {
      iVar1 = (int)uVar5;
      uVar8 = iVar1 + 1U & 0x3ff;
      uVar5 = (ulong)uVar8;
      (this->S).r[uVar5] = (this->S).r[iVar1 + 0x1f8U & 0x3ff] ^ (this->S).r[iVar1 + 0x359U & 0x3ff]
      ;
      n = n - 1;
    } while (n != 0);
    (this->S).index = uVar8;
  }
  return;
}

Assistant:

void discard(unsigned long long n) {
      const unsigned int matrix_size = B;
      using matrix_type = matrix<GF2, matrix_size>;
      using vector_type = vector<result_type, matrix_size>;
      using size_type = typename matrix_type::size_type;
      const unsigned long long n_pivot{int_math::log2_ceil(n) * B * B * B};
      constexpr auto mask = int_math::mask(B);
      if (n > n_pivot) {
        const unsigned long long n_partial{n - matrix_size};
        matrix_type M;
        for (size_type i{0}; i < matrix_size - 1; ++i)
          M(i, i + 1) = GF2(true);
        M(matrix_size - 1, matrix_size - B) = GF2(true);
        M(matrix_size - 1, matrix_size - A) = GF2(true);
        M = power(M, n_partial);
        vector_type V;
        for (size_type i{0}; i < matrix_size; ++i)
          V(matrix_size - 1 - i) = S.r[(S.index - i) & mask];
        vector_type W;
        for (size_type i{0}; i < matrix_size; ++i) {
          result_type sum{};
          for (size_type k{0}; k < matrix_size; ++k)
            sum ^= M(i, k) * V(k);
          W(i) = sum;
        }
        S.index = static_cast<unsigned int>(S.index + n_partial);
        S.index &= mask;
        for (size_type i{0}; i < matrix_size; ++i)
          S.r[(S.index - i) & mask] = W(matrix_size - 1 - i);
        n -= n_partial;
      }
      for (unsigned long long i{0}; i < n; ++i)
        step();
    }